

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

size_t create_circuit(ect *e,uint64_t max_label,uint64_t eliminations)

{
  ulong uVar1;
  uint uVar2;
  direction *pdVar3;
  v_array<v_array<unsigned_int>_> *pvVar4;
  ect *peVar5;
  v_array<direction> *pvVar6;
  v_array<v_array<v_array<unsigned_int>_>_> *pvVar7;
  uint uVar8;
  long lVar9;
  v_array<v_array<unsigned_int>_> *pvVar10;
  v_array<unsigned_int> *pvVar11;
  size_t sVar12;
  ulong uVar13;
  uint *puVar14;
  uint **ppuVar15;
  uint uVar16;
  uint *puVar17;
  uint *puVar18;
  long lVar19;
  ulong uVar20;
  uint32_t id;
  v_array<v_array<unsigned_int>_> tournaments;
  v_array<unsigned_int> empty;
  v_array<v_array<unsigned_int>_> new_tournaments;
  v_array<unsigned_int> t;
  uint local_124;
  ect *local_120;
  v_array<v_array<unsigned_int>_> local_118;
  uint *local_f8;
  uint local_f0;
  uint local_ec;
  undefined1 local_e8 [24];
  undefined8 uStack_d0;
  ulong uStack_c8;
  v_array<v_array<unsigned_int>_> local_b8;
  long local_98;
  uint64_t local_90;
  v_array<direction> *local_88;
  uint64_t local_80;
  v_array<v_array<v_array<unsigned_int>_>_> *local_78;
  long local_70;
  v_array<unsigned_int> *local_68;
  ulong local_60;
  v_array<unsigned_int> local_58;
  
  if (max_label == 1) {
    return 0;
  }
  local_118.end_array = (v_array<unsigned_int> *)0x0;
  local_118.erase_count = 0;
  local_118._begin = (v_array<unsigned_int> *)0x0;
  local_118._end = (v_array<unsigned_int> *)0x0;
  local_58.end_array = (uint *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (uint *)0x0;
  local_58._end = (uint *)0x0;
  local_b8._begin = (v_array<unsigned_int> *)((ulong)local_b8._begin & 0xffffffff00000000);
  local_120 = e;
  local_90 = eliminations;
  if (max_label != 0) {
    do {
      v_array<unsigned_int>::push_back(&local_58,(uint *)&local_b8);
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_e8._8_8_ = (uint *)0x0;
      local_e8._16_8_ = (uint *)0x0;
      local_e8._0_8_ = (ulong)local_b8._begin & 0xffffffff;
      v_array<direction>::push_back(&e->directions,(direction *)local_e8);
      uVar8 = (int)local_b8._begin + 1;
      local_b8._begin = (v_array<unsigned_int> *)CONCAT44(local_b8._begin._4_4_,uVar8);
    } while (uVar8 < max_label);
  }
  local_80 = max_label;
  v_array<v_array<unsigned_int>_>::push_back(&local_118,&local_58);
  lVar9 = local_90 - 1;
  local_98 = lVar9;
  if (lVar9 != 0) {
    do {
      local_e8._16_8_ = (uint *)0x0;
      uStack_d0 = 0;
      local_e8._0_8_ = (uint *)0x0;
      local_e8._8_8_ = (uint *)0x0;
      v_array<v_array<unsigned_int>_>::push_back(&local_118,(v_array<unsigned_int> *)local_e8);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  peVar5 = local_120;
  local_78 = &local_120->all_levels;
  v_array<v_array<v_array<unsigned_int>_>_>::push_back(local_78,&local_118);
  pvVar10 = (peVar5->all_levels)._begin;
  pvVar11 = pvVar10->_begin;
  lVar9 = (long)pvVar10->_end - (long)pvVar11;
  if (lVar9 != 0) {
    local_88 = &local_120->directions;
    uVar8 = (int)((ulong)((long)(local_120->directions)._end - (long)(local_120->directions)._begin)
                 >> 3) * -0x33333333;
    local_68 = &local_120->final_nodes;
    lVar19 = 0;
    do {
      uVar13 = lVar9 >> 5;
      if (pvVar11->_end == pvVar11->_begin) {
        ppuVar15 = &pvVar11[1]._end;
        uVar1 = 1;
        do {
          uVar20 = uVar1;
          if (uVar13 + (uVar13 == 0) == uVar20) break;
          puVar18 = *ppuVar15;
          pvVar11 = (v_array<unsigned_int> *)(ppuVar15 + -1);
          ppuVar15 = ppuVar15 + 4;
          uVar1 = uVar20 + 1;
        } while (puVar18 == pvVar11->_begin);
        if (uVar13 <= uVar20) break;
      }
      local_b8.end_array = (v_array<unsigned_int> *)0x0;
      local_b8.erase_count = 0;
      local_b8._begin = (v_array<unsigned_int> *)0x0;
      local_b8._end = (v_array<unsigned_int> *)0x0;
      local_118._begin = pvVar10->_begin;
      local_118._end = pvVar10->_end;
      local_118.end_array = pvVar10->end_array;
      local_118.erase_count = pvVar10->erase_count;
      local_70 = lVar19;
      if (local_118._end != local_118._begin) {
        uVar13 = 0;
        do {
          local_e8._16_8_ = (uint *)0x0;
          uStack_d0 = 0;
          local_e8._0_8_ = (uint *)0x0;
          local_e8._8_8_ = (uint *)0x0;
          v_array<v_array<unsigned_int>_>::push_back(&local_b8,(v_array<unsigned_int> *)local_e8);
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)((long)local_118._end - (long)local_118._begin >> 5));
      }
      if (local_118._end != local_118._begin) {
        puVar18 = (uint *)0x0;
        pvVar11 = local_118._begin;
        do {
          puVar17 = pvVar11[(long)puVar18]._begin;
          puVar14 = pvVar11[(long)puVar18]._end;
          uVar13 = (long)puVar14 - (long)puVar17;
          local_f8 = puVar18;
          if (4 < uVar13) {
            uVar1 = (long)puVar18 + 1;
            local_60 = (ulong)uVar8;
            uVar20 = 0;
            local_f0 = uVar8;
            do {
              local_124 = (int)local_60 + (int)uVar20;
              uVar8 = puVar17[uVar20 * 2];
              uVar2 = puVar17[uVar20 * 2 + 1];
              local_e8._0_8_ = ZEXT48(local_124);
              local_e8._16_8_ = (uint *)0x0;
              uStack_d0 = CONCAT44(uVar2,uVar8);
              uStack_c8 = uStack_c8 & 0xffffffffffffff00;
              local_e8._8_8_ = local_f8;
              v_array<direction>::push_back(local_88,(direction *)local_e8);
              pvVar6 = local_88;
              pdVar3 = (local_120->directions)._begin;
              uVar16 = (int)((ulong)((long)(local_120->directions)._end - (long)pdVar3) >> 3) *
                       -0x33333333 - 1;
              if ((uint *)pdVar3[uVar8].tournament == local_f8) {
                pdVar3[uVar8].winner = uVar16;
              }
              else {
                pdVar3[uVar8].loser = uVar16;
              }
              pdVar3 = local_88->_begin;
              if ((uint *)pdVar3[uVar2].tournament == local_f8) {
                pdVar3[uVar2].winner = uVar16;
              }
              else {
                pdVar3[uVar2].loser = uVar16;
              }
              if (local_88->_begin[uVar8].last == true) {
                local_88->_begin[uVar8].winner = uVar16;
              }
              if (((long)local_118._begin[(long)puVar18]._end -
                   (long)local_118._begin[(long)puVar18]._begin == 8) &&
                 ((local_f8 == (uint *)0x0 ||
                  (local_118._begin[(long)puVar18 - 1]._end ==
                   local_118._begin[(long)puVar18 - 1]._begin)))) {
                local_88->_begin[uVar16].last = true;
                if (uVar1 < (ulong)((long)local_118._end - (long)local_118._begin >> 5)) {
                  v_array<unsigned_int>::push_back(local_b8._begin + uVar1,&local_124);
                }
                else {
                  local_88->_begin[uVar16].winner = 0;
                }
                local_ec = (int)((ulong)((long)(local_120->directions)._end -
                                        (long)(local_120->directions)._begin) >> 3) * -0x33333333 -
                           1;
                puVar17 = &local_ec;
                pvVar11 = local_68;
              }
              else {
                puVar17 = &local_124;
                pvVar11 = local_b8._begin + (long)puVar18;
              }
              v_array<unsigned_int>::push_back(pvVar11,puVar17);
              if (uVar1 < (ulong)((long)local_118._end - (long)local_118._begin >> 5)) {
                v_array<unsigned_int>::push_back(local_b8._begin + uVar1,&local_124);
              }
              else {
                pvVar6->_begin[uVar16].loser = 0;
              }
              uVar20 = uVar20 + 1;
              puVar17 = local_118._begin[(long)puVar18]._begin;
              puVar14 = local_118._begin[(long)puVar18]._end;
              uVar13 = (long)puVar14 - (long)puVar17;
            } while (uVar20 < (ulong)((long)uVar13 >> 2) >> 1);
            uVar8 = local_f0 + (int)uVar20;
            pvVar11 = local_118._begin;
          }
          if ((uVar13 & 4) != 0) {
            local_e8._0_4_ = puVar14[-1];
            v_array<unsigned_int>::push_back(local_b8._begin + (long)puVar18,(uint *)local_e8);
            pvVar11 = local_118._begin;
          }
          puVar18 = (uint *)((long)local_f8 + 1);
        } while (puVar18 < (uint *)((long)local_118._end - (long)pvVar11 >> 5));
      }
      pvVar7 = local_78;
      v_array<v_array<v_array<unsigned_int>_>_>::push_back(local_78,&local_b8);
      lVar19 = local_70 + 1;
      pvVar4 = pvVar7->_begin;
      pvVar10 = pvVar4 + lVar19;
      pvVar11 = pvVar4[lVar19]._begin;
      lVar9 = (long)pvVar4[lVar19]._end - (long)pvVar11;
    } while (lVar9 != 0);
  }
  peVar5 = local_120;
  uVar8 = (int)local_90 * ((int)local_80 + -1);
  local_120->last_pair = uVar8;
  if (local_80 != 0) {
    sVar12 = final_depth(local_90);
    peVar5->tree_height = sVar12;
    uVar8 = peVar5->last_pair;
  }
  return local_98 + (ulong)uVar8;
}

Assistant:

size_t create_circuit(ect& e, uint64_t max_label, uint64_t eliminations)
{
  if (max_label == 1)
    return 0;

  v_array<v_array<uint32_t>> tournaments = v_init<v_array<uint32_t>>();
  v_array<uint32_t> t = v_init<uint32_t>();

  for (uint32_t i = 0; i < max_label; i++)
  {
    t.push_back(i);
    direction d = {i, 0, 0, 0, 0, 0, false};
    e.directions.push_back(d);
  }

  tournaments.push_back(t);

  for (size_t i = 0; i < eliminations - 1; i++) tournaments.push_back(v_array<uint32_t>());

  e.all_levels.push_back(tournaments);

  size_t level = 0;

  uint32_t node = (uint32_t)e.directions.size();

  while (not_empty(e.all_levels[level]))
  {
    v_array<v_array<uint32_t>> new_tournaments = v_init<v_array<uint32_t>>();
    tournaments = e.all_levels[level];

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      v_array<uint32_t> empty = v_init<uint32_t>();
      new_tournaments.push_back(empty);
    }

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      for (size_t j = 0; j < tournaments[t].size() / 2; j++)
      {
        uint32_t id = node++;
        uint32_t left = tournaments[t][2 * j];
        uint32_t right = tournaments[t][2 * j + 1];

        direction d = {id, t, 0, 0, left, right, false};
        e.directions.push_back(d);
        uint32_t direction_index = (uint32_t)e.directions.size() - 1;
        if (e.directions[left].tournament == t)
          e.directions[left].winner = direction_index;
        else
          e.directions[left].loser = direction_index;
        if (e.directions[right].tournament == t)
          e.directions[right].winner = direction_index;
        else
          e.directions[right].loser = direction_index;
        if (e.directions[left].last == true)
          e.directions[left].winner = direction_index;

        if (tournaments[t].size() == 2 && (t == 0 || tournaments[t - 1].size() == 0))
        {
          e.directions[direction_index].last = true;
          if (t + 1 < tournaments.size())
            new_tournaments[t + 1].push_back(id);
          else  // winner eliminated.
            e.directions[direction_index].winner = 0;
          e.final_nodes.push_back((uint32_t)(e.directions.size() - 1));
        }
        else
          new_tournaments[t].push_back(id);
        if (t + 1 < tournaments.size())
          new_tournaments[t + 1].push_back(id);
        else  // loser eliminated.
          e.directions[direction_index].loser = 0;
      }
      if (tournaments[t].size() % 2 == 1)
        new_tournaments[t].push_back(tournaments[t].last());
    }
    e.all_levels.push_back(new_tournaments);
    level++;
  }

  e.last_pair = (uint32_t)((max_label - 1) * eliminations);

  if (max_label > 1)
    e.tree_height = final_depth(eliminations);

  return e.last_pair + (eliminations - 1);
}